

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cpp
# Opt level: O0

uint __thiscall
Kernel::Signature::addFreshFunction(Signature *this,uint arity,char *prefix,char *suffix)

{
  Symbol *this_00;
  long in_RCX;
  allocator<char> *in_RDX;
  long in_RDI;
  Symbol *sym;
  uint result;
  bool added;
  string suf;
  string pref;
  bool *in_stack_00000160;
  uint in_stack_0000016c;
  string *in_stack_00000170;
  Signature *in_stack_00000178;
  uint in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  uint uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  string local_108 [4];
  int in_stack_fffffffffffffefc;
  string local_e8 [32];
  string local_c8 [36];
  uint local_a4;
  byte local_9e;
  byte local_9d;
  allocator<char> local_9c;
  byte local_9b;
  byte local_9a;
  allocator<char> local_99;
  string local_98 [32];
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  long local_20;
  
  __s = &local_41;
  local_20 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffef0,(char *)__s,in_RDX);
  std::allocator<char>::~allocator(&local_41);
  local_9a = 0;
  local_9b = 0;
  local_9d = 0;
  if (local_20 == 0) {
    std::allocator<char>::allocator();
    local_9d = 1;
    std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffef0,(char *)__s,in_RDX)
    ;
  }
  else {
    std::allocator<char>::allocator();
    local_9a = 1;
    std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffef0,(char *)__s,in_RDX)
    ;
    local_9b = 1;
    std::operator+(in_stack_fffffffffffffeb8,
                   (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  }
  if ((local_9d & 1) != 0) {
    std::allocator<char>::~allocator(&local_9c);
  }
  if ((local_9b & 1) != 0) {
    std::__cxx11::string::~string(local_98);
  }
  if ((local_9a & 1) != 0) {
    std::allocator<char>::~allocator(&local_99);
  }
  do {
    *(int *)(in_RDI + 0x160) = *(int *)(in_RDI + 0x160) + 1;
    Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffffefc);
    std::operator+(in_stack_fffffffffffffeb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    std::operator+(in_stack_fffffffffffffeb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    local_a4 = addFunction(in_stack_00000178,in_stack_00000170,in_stack_0000016c,in_stack_00000160);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_108);
  } while (((local_9e ^ 0xff) & 1) != 0);
  this_00 = getFunction((Signature *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        in_stack_fffffffffffffeac);
  Symbol::markIntroduced(this_00);
  Symbol::markSkip(this_00);
  uVar1 = local_a4;
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return uVar1;
}

Assistant:

unsigned Signature::addFreshFunction(unsigned arity, const char* prefix, const char* suffix)
{
  std::string pref(prefix);
  std::string suf(suffix ? std::string("_")+suffix : "");
  bool added;
  unsigned result;
  //commented out because it could lead to introduction of function with the same name
  //that differ only in arity (which is OK with tptp, but iProver was complaining when
  //using Vampire as clausifier)
//  unsigned result = addFunction(pref+suf,arity,added);
//  if (!added) {
    do {
      result = addFunction(pref+Int::toString(_nextFreshSymbolNumber++)+suf,arity,added);
    }
    while (!added);
//  }
  Symbol* sym = getFunction(result);
  sym->markIntroduced();
  sym->markSkip();
  return result;
}